

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

void Options::saveOptions(OptionsData *optionsData)

{
  mapped_type_conflict mVar1;
  mapped_type_conflict *pmVar2;
  mapped_type *pmVar3;
  key_type local_2c;
  
  graphicMode = optionsData->graphicMode;
  tileSize = optionsData->tileSize;
  mVar1 = optionsData->imageToLoad_4;
  local_2c = FOUR;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,&local_2c);
  *pmVar2 = mVar1;
  mVar1 = optionsData->imageToLoad_5;
  local_2c = FIVE;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,&local_2c);
  *pmVar2 = mVar1;
  mVar1 = optionsData->imageToLoad_6;
  local_2c = SIX;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,&local_2c);
  *pmVar2 = mVar1;
  mVar1 = optionsData->imageToLoad_7;
  local_2c = SEVEN;
  pmVar2 = std::
           map<BoardSize,_bool,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_bool>_>_>
           ::at(&imagesToLoad,&local_2c);
  *pmVar2 = mVar1;
  tileColor = optionsData->squareColor;
  numberColor = optionsData->numberColor;
  pmVar3 = std::
           map<TileSize,_FontSize,_std::less<TileSize>,_std::allocator<std::pair<const_TileSize,_FontSize>_>_>
           ::at(&Maps::tileSizeFontSize,&tileSize);
  fontSize = *pmVar3;
  return;
}

Assistant:

void Options::saveOptions( OptionsData&  optionsData )
{
    graphicMode = optionsData.graphicMode;
    tileSize = optionsData.tileSize;
    imagesToLoad.at( BoardSize::FOUR ) = optionsData.imageToLoad_4;
    imagesToLoad.at( BoardSize::FIVE ) = optionsData.imageToLoad_5;
    imagesToLoad.at( BoardSize::SIX ) = optionsData.imageToLoad_6;
    imagesToLoad.at( BoardSize::SEVEN ) = optionsData.imageToLoad_7;
    tileColor = optionsData.squareColor;
    numberColor = optionsData.numberColor;
    fontSize = Maps::tileSizeFontSize.at( tileSize );
}